

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O2

void USPE(double *inp,int N,int p,int q,double *phi,double *theta,double *thetac,double *var)

{
  size_t __size;
  int iVar1;
  uint N_00;
  uint uVar2;
  double *acov;
  long lVar3;
  double *A;
  double *b;
  int *ipiv;
  double *__ptr;
  undefined8 *__ptr_00;
  double *array;
  double *__ptr_01;
  double *x;
  double *A_00;
  int *ipiv_00;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  int iVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  
  uVar8 = (ulong)(uint)q;
  iVar1 = p + 1 + q;
  acov = (double *)malloc((long)iVar1 * 8);
  lVar3 = (long)p;
  A = (double *)malloc(lVar3 * 8 * lVar3);
  b = (double *)malloc(lVar3 * 8);
  ipiv = (int *)malloc(lVar3 * 4);
  N_00 = q + 1;
  lVar16 = (long)q;
  __size = lVar16 * 8 + 8;
  __ptr = (double *)malloc(__size);
  __ptr_00 = (undefined8 *)malloc((long)(int)(p + 1U) << 3);
  array = (double *)malloc(__size);
  __ptr_01 = (double *)malloc(__size);
  x = (double *)malloc(__size);
  A_00 = (double *)malloc((lVar16 + 1) * __size);
  ipiv_00 = (int *)malloc(lVar16 * 4 + 4);
  autocovar(inp,N,acov,iVar1);
  dVar17 = mean(inp,N);
  *__ptr_00 = 0xbff0000000000000;
  uVar4 = 0;
  uVar15 = 0;
  if (0 < p) {
    uVar15 = (ulong)(uint)p;
  }
  for (; uVar15 != uVar4; uVar4 = uVar4 + 1) {
    phi[uVar4] = 0.0;
  }
  uVar5 = 0;
  uVar4 = 0;
  if (0 < q) {
    uVar4 = uVar8;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    theta[uVar5] = 0.0;
  }
  uVar5 = (ulong)(p + 1U);
  if (0 < p) {
    pdVar6 = A;
    for (uVar7 = 1; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      iVar1 = (int)uVar8;
      for (lVar13 = 0; uVar5 - 1 != lVar13; lVar13 = lVar13 + 1) {
        iVar10 = (int)uVar8;
        uVar12 = (ulong)(uint)-iVar10;
        if (0 < iVar10) {
          uVar12 = uVar8;
        }
        pdVar6[lVar13] = acov[uVar12];
        uVar8 = (ulong)(iVar10 - 1);
      }
      pdVar6 = pdVar6 + lVar3;
      uVar8 = (ulong)(iVar1 + 1);
    }
    for (uVar8 = 0; (uint)p != uVar8; uVar8 = uVar8 + 1) {
      b[uVar8] = acov[lVar16 + uVar8 + 1];
    }
    ludecomp(A,p,ipiv);
    linsolve(A,p,b,ipiv,phi);
  }
  for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
    __ptr_00[uVar8 + 1] = phi[uVar8];
  }
  if (p == 0) {
    for (lVar3 = 0; lVar3 <= lVar16; lVar3 = lVar3 + 1) {
      __ptr[lVar3] = acov[lVar3];
    }
  }
  else {
    for (uVar8 = 0; (long)uVar8 <= lVar16; uVar8 = uVar8 + 1) {
      dVar18 = 0.0;
      uVar7 = uVar8 & 0xffffffff;
      for (lVar13 = 0; lVar13 <= lVar3; lVar13 = lVar13 + 1) {
        iVar1 = (int)uVar7;
        for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
          iVar10 = (int)uVar7;
          uVar14 = (ulong)(uint)-iVar10;
          if (0 < iVar10) {
            uVar14 = uVar7;
          }
          dVar18 = dVar18 + (double)__ptr_00[lVar13] * (double)__ptr_00[uVar12] * acov[uVar14];
          uVar7 = (ulong)(iVar10 - 1);
        }
        uVar7 = (ulong)(iVar1 + 1);
      }
      __ptr[uVar8] = dVar18;
    }
  }
  for (lVar3 = 0; lVar3 <= lVar16; lVar3 = lVar3 + 1) {
    __ptr_01[lVar3] = 0.0;
    array[lVar3] = 0.0;
  }
  dVar18 = *__ptr;
  if (dVar18 < 0.0) {
    dVar18 = sqrt(dVar18);
  }
  else {
    dVar18 = SQRT(dVar18);
  }
  *__ptr_01 = dVar18;
  pdVar6 = __ptr_01;
  for (lVar3 = 0; lVar3 <= lVar16; lVar3 = lVar3 + 1) {
    for (lVar13 = 0; lVar13 <= lVar16 - lVar3; lVar13 = lVar13 + 1) {
      array[lVar3] = __ptr_01[lVar13] * pdVar6[lVar13] + array[lVar3];
    }
    array[lVar3] = array[lVar3] - __ptr[lVar3];
    pdVar6 = pdVar6 + 1;
  }
  for (uVar2 = 0; (dVar18 = array_max_abs(array,N_00), 0.0001 < dVar18 && (uVar2 < 200));
      uVar2 = uVar2 + 1) {
    lVar3 = 0;
    pdVar6 = __ptr_01;
    pdVar9 = __ptr_01;
    pdVar11 = A_00;
    for (lVar13 = 0; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
      for (uVar8 = 0; N_00 != uVar8; uVar8 = uVar8 + 1) {
        dVar18 = 0.0;
        if ((long)(lVar13 + uVar8) <= lVar16) {
          dVar18 = pdVar9[uVar8] + 0.0;
        }
        if (-1 < (long)(lVar3 + uVar8)) {
          dVar18 = dVar18 + pdVar6[uVar8];
        }
        pdVar11[uVar8] = dVar18;
      }
      pdVar11 = pdVar11 + lVar16 + 1;
      pdVar9 = pdVar9 + 1;
      lVar3 = lVar3 + -1;
      pdVar6 = pdVar6 + -1;
    }
    ludecomp(A_00,N_00,ipiv_00);
    linsolve(A_00,N_00,array,ipiv_00,x);
    for (lVar3 = 0; lVar3 <= lVar16; lVar3 = lVar3 + 1) {
      __ptr_01[lVar3] = __ptr_01[lVar3] - x[lVar3];
      array[lVar3] = 0.0;
    }
    pdVar6 = __ptr_01;
    for (lVar3 = 0; lVar3 <= lVar16; lVar3 = lVar3 + 1) {
      dVar18 = array[lVar3];
      for (lVar13 = 0; lVar13 <= lVar16 - lVar3; lVar13 = lVar13 + 1) {
        dVar18 = dVar18 + __ptr_01[lVar13] * pdVar6[lVar13];
        array[lVar3] = dVar18;
      }
      array[lVar3] = dVar18 - __ptr[lVar3];
      pdVar6 = pdVar6 + 1;
    }
  }
  if (0 < p) {
    dVar18 = 0.0;
    for (uVar8 = 0; (uint)p != uVar8; uVar8 = uVar8 + 1) {
      dVar18 = dVar18 + (double)__ptr_00[uVar8 + 1];
    }
    dVar17 = dVar17 * (1.0 - dVar18);
  }
  *thetac = dVar17;
  for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
    theta[uVar8] = -__ptr_01[uVar8 + 1] / *__ptr_01;
  }
  *var = *__ptr_01 * *__ptr_01;
  if (q == 0) {
    dVar17 = 0.0;
    for (uVar4 = 0; uVar15 != uVar4; uVar4 = uVar4 + 1) {
      dVar17 = dVar17 + acov[uVar4 + 1] * (double)__ptr_00[uVar4 + 1];
    }
    *var = *acov - dVar17;
  }
  free(acov);
  free(A);
  free(b);
  free(ipiv);
  free(__ptr);
  free(__ptr_00);
  free(array);
  free(__ptr_01);
  free(A_00);
  free(ipiv_00);
  free(x);
  return;
}

Assistant:

void USPE(double *inp,int N,int p, int q, double *phi,double *theta,double *thetac,double *var) {
	int K,i,j,l,t,temp,it1;
	double wmean,tempd,epsilon;
	double *b,*c,*A,*c2,*x,*f,*tau,*T,*h;
	int *ipiv,*ipiv2;

	K = p + q + 1;

	c = (double *) malloc(sizeof(double) * K);
	A = (double *) malloc(sizeof(double) * p * p);
	b = (double *) malloc(sizeof(double) * p);
	ipiv = (int *) malloc(sizeof(int) * p);
	c2 = (double *) malloc(sizeof(double) * (q+1));
	x = (double *) malloc(sizeof(double) * (p+1));
	f = (double *) malloc(sizeof(double) * (q+1));
	tau = (double *) malloc(sizeof(double) * (q+1));
	h = (double *) malloc(sizeof(double) * (q+1));
	T = (double *) malloc(sizeof(double) * (q+1) * (q+1));
	ipiv2 = (int *) malloc(sizeof(int) * (q+1));


	autocovar(inp,N,c,K);
	wmean = mean(inp,N);
	x[0] = -1.0;

	for(i = 0; i < p;++i) {
		phi[i] = 0.0;
	}

	for(i = 0; i < q;++i) {
		theta[i] = 0.0;
	}

	//Step 1
	if (p > 0) {

		for(i = 1; i <= p;++i) {
			t = (i-1) * p;
			for(j = 1; j <= p;++j) {
				temp = q+i-j;
				if (temp < 0) {
					temp = -temp;
				}
				A[t+j-1] = c[temp];
			}
		}

		for(i = 0; i < p;++i) {
			b[i] = c[q+i+1];
		}

		ludecomp(A,p,ipiv);
		linsolve(A,p,b,ipiv,phi);

	}


	for(i = 0; i < p;++i) {
		x[i+1] = phi[i];
	}

	// Step 2
	if (p == 0) {
		for(i = 0; i < q + 1; ++i) {
			c2[i] = c[i];
		}
	} else {
		for(j = 0; j < q + 1;++j) {
			tempd = 0.0;
			for(i = 0; i < p + 1;++i) {
				for(l = 0; l < p + 1; ++l) {
					temp = j + i - l;
					if (temp < 0) {
						temp = -temp;
					}
					tempd += x[i]*x[l]*c[temp];
				}
			}
			c2[j] = tempd;
		}

	}

	//Step 3 Newton Raphson Method

	epsilon = 0.0001;

	for(i = 0; i <= q;++i) {
		tau[i] = 0.0;
		f[i] = 0.0;
	}
	tau[0] = sqrt(c2[0]);

	for(j = 0; j <= q;++j) {
		for(i = 0; i < q-j+1;++i) {
			f[j] += tau[i] * tau[i+j];
		}
		f[j] -= c2[j];
	}

	it1 = 0;

	while (array_max_abs(f,q+1) > epsilon && it1 < 200) {
		it1++;
		for(i = 0; i < q+1;++i) {
			t = i * (q+1);
			for(j = 0; j < q+1;++j) {
				tempd = 0.0;
				if (i + j <= q) {
					tempd=tempd+tau[i+j];
				}
				if (j - i >= 0 ) {
					tempd=tempd+tau[j-i];
				}
				T[t+j] = tempd;
			}
		}
		//mdisplay(T,q+1,q+1);
		ludecomp(T,q+1,ipiv2);
		linsolve(T,q+1,f,ipiv2,h);

		for(i = 0; i < q+1;++i) {
			tau[i] = tau[i] - h[i];
			f[i] = 0.0;
		}

		for(j = 0; j < q+1;++j) {
			for(i = 0; i < q-j+1;++i) {
				f[j]=f[j]+tau[i]*tau[i+j];
			}
			f[j] = f[j] - c2[j];
		}
	}

	*thetac = 0.0;

	if (p > 0) {
		tempd = 0.0;
		for(i = 0; i < p;++i) {
			tempd += x[i+1];
		}
		*thetac = wmean * (1.0 - tempd);
	} else {
		*thetac = wmean;
	}

	for(j = 1; j < q+1;++j) {
		theta[j-1]=-1.0*tau[j]/tau[0];
	}

	*var = tau[0] * tau[0];

	if (q == 0) {
		tempd = 0.0;
		for(i = 0; i < p;++i) {
			tempd = tempd + c[i+1] * x[i+1];
		}
		*var = c[0] - tempd;
	}

	free(c);
	free(A);
	free(b);
	free(ipiv);
	free(c2);
	free(x);
	free(f);
	free(tau);
	free(T);
	free(ipiv2);
	free(h);
}